

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
         *this)

{
  void *pvVar1;
  PositionType minPosition;
  PositionType minPosition_00;
  Particle<(pica::Dimension)3> particle;
  Particle<(pica::Dimension)3> particle_00;
  PositionType maxPosition;
  PositionType maxPosition_00;
  bool bVar2;
  long lVar3;
  Particle *pPVar4;
  double *pdVar5;
  int iVar6;
  byte bVar7;
  PositionType position_1;
  PositionType position;
  ParticleArray particles;
  ParticleArray particlesAnotherCopy;
  ParticleArray particlesCopy;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 in_stack_fffffffffffffc48 [24];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  AssertHelper local_390;
  char *local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  AssertionResult local_368;
  long local_358 [2];
  ParticleArray local_348;
  ParticleArray local_270;
  ParticleArray local_198;
  Particle local_c0;
  Particle local_78;
  
  bVar7 = 0;
  memset(&local_348,0,0xd8);
  memset(&local_198,0,0xd8);
  memset(&local_270,0,0xd8);
  iVar6 = 9;
  do {
    local_368.success_ = false;
    local_368._1_7_ = 0xc0240000000000;
    local_368.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    local_358[0] = -0x3fdc000000000000;
    local_388 = (char *)0x4024000000000000;
    uStack_380 = 0x4024000000000000;
    local_378 = 0x4024000000000000;
    uVar13 = 0x4024000000000000;
    uVar11 = 0x4024000000000000;
    uVar12 = 0x4024000000000000;
    uVar10 = 0xc024000000000000;
    dVar8 = -10.0;
    uVar9 = 0xc024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    pPVar4 = &local_78;
    pdVar5 = (double *)&stack0xfffffffffffffc18;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar5 = (pPVar4->position).x;
      pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar7 * -0x10 + 8);
      pdVar5 = pdVar5 + (ulong)bVar7 * -2 + 1;
    }
    particle.position.y = (double)uVar9;
    particle.position.x = dVar8;
    particle.position.z = (double)uVar10;
    particle.p.x = (double)uVar11;
    particle.p.y = (double)uVar12;
    particle.p.z = (double)uVar13;
    particle.factor = (FactorType)in_stack_fffffffffffffc48._0_8_;
    particle.invGamma = (GammaType)in_stack_fffffffffffffc48._8_8_;
    particle.typeIndex = in_stack_fffffffffffffc48._16_2_;
    particle._66_6_ = in_stack_fffffffffffffc48._18_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&local_348,particle);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0xb;
  do {
    local_368.success_ = false;
    local_368._1_7_ = 0xc0240000000000;
    local_368.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    local_358[0] = -0x3fdc000000000000;
    local_388 = (char *)0x4024000000000000;
    uStack_380 = 0x4024000000000000;
    local_378 = 0x4024000000000000;
    uVar13 = 0x4024000000000000;
    uVar11 = 0x4024000000000000;
    uVar12 = 0x4024000000000000;
    uVar10 = 0xc024000000000000;
    dVar8 = -10.0;
    uVar9 = 0xc024000000000000;
    minPosition_00.y = -10.0;
    minPosition_00.x = -10.0;
    minPosition_00.z = -10.0;
    maxPosition_00.y = 10.0;
    maxPosition_00.x = 10.0;
    maxPosition_00.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_c0,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition_00,maxPosition_00);
    pPVar4 = &local_c0;
    pdVar5 = (double *)&stack0xfffffffffffffc18;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar5 = (pPVar4->position).x;
      pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar7 * -0x10 + 8);
      pdVar5 = pdVar5 + (ulong)bVar7 * -2 + 1;
    }
    particle_00.position.y = (double)uVar9;
    particle_00.position.x = dVar8;
    particle_00.position.z = (double)uVar10;
    particle_00.p.x = (double)uVar11;
    particle_00.p.y = (double)uVar12;
    particle_00.p.z = (double)uVar13;
    particle_00.factor = (FactorType)in_stack_fffffffffffffc48._0_8_;
    particle_00.invGamma = (GammaType)in_stack_fffffffffffffc48._8_8_;
    particle_00.typeIndex = in_stack_fffffffffffffc48._16_2_;
    particle_00._66_6_ = in_stack_fffffffffffffc48._18_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&local_198,particle_00);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar3 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_198.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0x48;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_198.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x90);
  std::vector<double,_std::allocator<double>_>::operator=(&local_198.factors,&local_348.factors);
  std::vector<double,_std::allocator<double>_>::operator=(&local_198.invGammas,&local_348.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_198.typeIndex,&local_348.typeIndex);
  lVar3 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_270.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0x48;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_270.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x90);
  std::vector<double,_std::allocator<double>_>::operator=(&local_270.factors,&local_348.factors);
  std::vector<double,_std::allocator<double>_>::operator=(&local_270.invGammas,&local_348.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_270.typeIndex,&local_348.typeIndex);
  bVar2 = ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
          eqParticleArrays(&this->
                            super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                           ,&local_348,&local_198);
  local_368.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_368.success_ = bVar2;
  if (bVar2) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_368.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_368.success_ =
         ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
         eqParticleArrays(&this->
                           super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                          ,&local_348,&local_270);
    local_368.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!local_368.success_) {
      testing::Message::Message((Message *)&local_398);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_388,&local_368,
                 "this->eqParticleArrays(particles, particlesAnotherCopy)","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x3a,local_388);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      if (local_388 != (char *)0x0) {
        operator_delete__(local_388);
      }
      if (local_398.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_398.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_398.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_368.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_388,&local_368,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x39,local_388);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_388 != (char *)0x0) {
      operator_delete__(local_388);
    }
    if (local_398.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_398.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_398.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_368.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_270.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0x88;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_348.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_270.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar3) -
                             (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_348.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_270.positions + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if (local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0x88;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_270.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_198.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar3) -
                             (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_270.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_198.positions + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if (local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0x88;
  do {
    pvVar1 = *(void **)((long)local_358 + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_348.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar3) -
                             (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)local_358 + lVar3 + -8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_358 + lVar3 + 8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}